

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmt_bin_decode_nvidia.c
# Opt level: O3

uint load_create_object(mmt_nvidia_create_object **create_,uint pfx)

{
  uint sz;
  int iVar1;
  void *pvVar2;
  mmt_nvidia_create_object *pmVar3;
  
  pvVar2 = mmt_load_data_with_prefix(0x13,pfx,0);
  mmt_buf_check_sanity((mmt_buf *)((long)pvVar2 + 0xe));
  iVar1 = *(int *)((long)pvVar2 + 0xe);
  sz = iVar1 + 0x13;
  pmVar3 = (mmt_nvidia_create_object *)mmt_load_data_with_prefix(sz,pfx,0);
  mmt_check_eor(iVar1 + pfx + 0x13);
  if (create_ != (mmt_nvidia_create_object **)0x0) {
    *create_ = pmVar3;
  }
  return sz;
}

Assistant:

static unsigned int load_create_object(struct mmt_nvidia_create_object **create_, unsigned int pfx)
{
	unsigned int size = sizeof(struct mmt_nvidia_create_object) + 1;
	struct mmt_nvidia_create_object *create;
	create = mmt_load_data_with_prefix(size, pfx, 0);
	mmt_buf_check_sanity(&create->name);
	size += create->name.len;
	create = mmt_load_data_with_prefix(size, pfx, 0);

	mmt_check_eor(size + pfx);

	if (create_)
		*create_ = create;
	return size;
}